

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O2

int RDL_checkInvalidConsistency(RDL_data *data)

{
  uint uVar1;
  int iVar2;
  RDL_graph *pRVar3;
  RDL_data *pRVar4;
  RDL_cycleIterator *pRVar5;
  RDL_cycleIterator *pRVar6;
  RDL_cycle *pRVar7;
  uint uVar8;
  double dVar9;
  uint *families;
  RDL_cycle **cycle_array;
  RDL_node *nodes;
  RDL_edge *edges;
  double local_38;
  
  (*RDL_outputFunc)(RDL_DEBUG,"The following errors are expected {\n");
  pRVar3 = RDL_initNewGraph(0);
  pRVar4 = RDL_calculate((RDL_graph *)0x0);
  if (pRVar4 != (RDL_data *)0x0) {
    fwrite("failed to detect invalid result: RDL_calculate(NULL)\n",0x35,1,_stderr);
  }
  uVar8 = (uint)(pRVar4 != (RDL_data *)0x0);
  pRVar4 = RDL_calculate(pRVar3);
  if (pRVar4 != (RDL_data *)0x0) {
    fwrite("failed to detect invalid result: RDL_calculate(empty_graph)\n",0x3c,1,_stderr);
    uVar8 = 1;
  }
  RDL_deleteGraph(pRVar3);
  pRVar3 = RDL_initNewGraph(2);
  uVar1 = RDL_addUEdge(pRVar3,1,2);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_addUEdge(empty_graph, 1, 2)\n",0x41,1,_stderr);
    uVar8 = 1;
  }
  RDL_addUEdge(pRVar3,0,1);
  uVar1 = RDL_addUEdge(pRVar3,1,0);
  if (uVar1 != 0xfffffffe) {
    fwrite("failed to detect invalid result: RDL_addUEdge(empty_graph, 0, 1)\n",0x41,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_addUEdge(pRVar3,1,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_addUEdge(empty_graph, 1, 1)\n",0x41,1,_stderr);
    uVar8 = 1;
  }
  RDL_deleteGraph(pRVar3);
  uVar1 = RDL_getNofURF((RDL_data *)0x0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofURF(NULL)\n",0x35,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofRCF((RDL_data *)0x0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofRCF(NULL)\n",0x35,1,_stderr);
    uVar8 = 1;
  }
  dVar9 = RDL_getNofRCForURF(data,0x7fffffff);
  local_38 = 1.79769313486232e+308;
  if ((dVar9 != 1.79769313486232e+308) || (NAN(dVar9))) {
    fwrite("failed to detect invalid result: RDL_getNofRCForURF(data, VeryHighIndex)\n",0x49,1,
           _stderr);
    uVar8 = 1;
  }
  dVar9 = RDL_getNofRCForURF((RDL_data *)0x0,0);
  if ((dVar9 != local_38) || (NAN(dVar9) || NAN(local_38))) {
    fwrite("failed to detect invalid result: RDL_getNofRCForURF(NULL, 0)\n",0x3d,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getEdgeId(data,1,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgeId(data, 1, 1)\n",0x3b,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getEdgeId((RDL_data *)0x0,1,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgeId(data, 1, 1)\n",0x3b,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getEdgeId(data,0x7fffffff,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgeId(data, VeryHighIndex, 1)\n",0x47,1,_stderr
          );
    uVar8 = 1;
  }
  uVar1 = RDL_getEdgeId(data,1,0x7fffffff);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgeId(data, 1, VeryHighIndex)\n",0x47,1,_stderr
          );
    uVar8 = 1;
  }
  dVar9 = RDL_getNofRCForRCF(data,0x7fffffff);
  if ((dVar9 != local_38) || (NAN(dVar9) || NAN(local_38))) {
    fwrite("failed to detect invalid result: RDL_getNofRCForRCF(data, VeryHighIndex)\n",0x49,1,
           _stderr);
    uVar8 = 1;
  }
  dVar9 = RDL_getNofRCForRCF((RDL_data *)0x0,0);
  if ((dVar9 != local_38) || (NAN(dVar9) || NAN(local_38))) {
    fwrite("failed to detect invalid result: RDL_getNofRCForRCF(NULL, 0)\n",0x3d,1,_stderr);
    uVar8 = 1;
  }
  dVar9 = RDL_getNofRC((RDL_data *)0x0);
  if ((dVar9 != local_38) || (NAN(dVar9) || NAN(local_38))) {
    fwrite("failed to detect invalid result: RDL_getNofRC(NULL)\n",0x34,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getRCyclesForURF(data,0x7fffffff,&cycle_array);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForURF(data, VeryHighIndex, &cycle_array1)\n"
           ,0x5a,1,_stderr);
    uVar8 = 1;
  }
  RDL_deleteCycles(cycle_array,0);
  uVar1 = RDL_getRCyclesForURF((RDL_data *)0x0,0,&cycle_array);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForURF(NULL, 0, &cycle_array1)\n",0x4e,1,
           _stderr);
    uVar8 = 1;
  }
  RDL_deleteCycles(cycle_array,0);
  pRVar5 = RDL_getRCyclesForURFIterator(data,0x7fffffff);
  if (pRVar5 != (RDL_cycleIterator *)0x0) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForURFIterator(data, VeryHighIndex)\n",
           0x53,1,_stderr);
    uVar8 = 1;
  }
  pRVar5 = RDL_getRCyclesForURFIterator((RDL_data *)0x0,0);
  if (pRVar5 != (RDL_cycleIterator *)0x0) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForURFIterator(NULL, 0)\n",0x47,1,_stderr
          );
    uVar8 = 1;
  }
  uVar1 = RDL_getRCyclesForRCF(data,0x7fffffff,&cycle_array);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForRCF(data, VeryHighIndex, &cycle_array1)\n"
           ,0x5a,1,_stderr);
    uVar8 = 1;
  }
  RDL_deleteCycles(cycle_array,0);
  uVar1 = RDL_getRCyclesForRCF((RDL_data *)0x0,0,&cycle_array);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForRCF(NULL, 0, &cycle_array1)\n",0x4e,1,
           _stderr);
    uVar8 = 1;
  }
  RDL_deleteCycles(cycle_array,0);
  pRVar5 = RDL_getRCyclesForRCFIterator(data,0x7fffffff);
  if (pRVar5 != (RDL_cycleIterator *)0x0) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForRCFIterator(data, VeryHighIndex)\n",
           0x53,1,_stderr);
    uVar8 = 1;
  }
  pRVar5 = RDL_getRCyclesForRCFIterator((RDL_data *)0x0,0);
  if (pRVar5 != (RDL_cycleIterator *)0x0) {
    fwrite("failed to detect invalid result: RDL_getRCyclesForRCFIterator(NULL, 0)\n",0x47,1,_stderr
          );
    uVar8 = 1;
  }
  uVar1 = RDL_getRCycles((RDL_data *)0x0,&cycle_array);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCycles(NULL, &cycle_array1)\n",0x45,1,_stderr);
    uVar8 = 1;
  }
  RDL_deleteCycles(cycle_array,0);
  pRVar5 = RDL_getRCyclesIterator((RDL_data *)0x0);
  if (pRVar5 != (RDL_cycleIterator *)0x0) {
    fwrite("failed to detect invalid result: RDL_getRCyclesIterator(NULL)\n",0x3e,1,_stderr);
    uVar8 = 1;
  }
  iVar2 = RDL_cycleIteratorAtEnd((RDL_cycleIterator *)0x0);
  if (iVar2 == 0) {
    fwrite("failed to detect invalid result: RDL_cycleIteratorAtEnd(NULL)\n",0x3e,1,_stderr);
    uVar8 = 1;
  }
  pRVar5 = RDL_getRCyclesIterator(data);
  while( true ) {
    iVar2 = RDL_cycleIteratorAtEnd(pRVar5);
    if (iVar2 != 0) break;
    RDL_cycleIteratorNext(pRVar5);
  }
  if (pRVar5 == (RDL_cycleIterator *)0x0) {
LAB_00109c95:
    fwrite("failed to detect invalid result: RDL_cycleIteratorNext(it)\n",0x3b,1,_stderr);
    uVar8 = 1;
  }
  else {
    pRVar6 = RDL_cycleIteratorNext(pRVar5);
    if (pRVar6 != (RDL_cycleIterator *)0x0) goto LAB_00109c95;
  }
  pRVar6 = RDL_cycleIteratorNext((RDL_cycleIterator *)0x0);
  if (pRVar6 != (RDL_cycleIterator *)0x0) {
    fwrite("failed to detect invalid result: RDL_cycleIteratorNext(NULL)\n",0x3d,1,_stderr);
    uVar8 = 1;
  }
  pRVar7 = RDL_cycleIteratorGetCycle((RDL_cycleIterator *)0x0);
  if (pRVar7 != (RDL_cycle *)0x0) {
    fwrite("failed to detect invalid result: RDL_cycleIteratorGetCycle(NULL)\n",0x41,1,_stderr);
    uVar8 = 1;
  }
  if (pRVar5 != (RDL_cycleIterator *)0x0) {
    pRVar7 = RDL_cycleIteratorGetCycle(pRVar5);
    if (pRVar7 == (RDL_cycle *)0x0) goto LAB_00109745;
  }
  fwrite("failed to detect invalid result: RDL_cycleIteratorGetCycle(it)\n",0x3f,1,_stderr);
  uVar8 = 1;
LAB_00109745:
  RDL_deleteCycleIterator(pRVar5);
  uVar1 = RDL_getRCPrototypes((RDL_data *)0x0,&cycle_array);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCPrototypes(NULL, &cycle_array1)\n",0x4a,1,
           _stderr);
    uVar8 = 1;
  }
  RDL_deleteCycles(cycle_array,0);
  uVar1 = RDL_getSSSR((RDL_data *)0x0,&cycle_array);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getSSSR(NULL, &cycle_array1)\n",0x42,1,_stderr);
    uVar8 = 1;
  }
  RDL_deleteCycles(cycle_array,0);
  uVar1 = RDL_getWeightForURF(data,0x7fffffff);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getWeightForURF(data, VeryHighIndex)\n",0x4a,1,
           _stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getWeightForURF((RDL_data *)0x0,0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getWeightForURF(NULL, 0)\n",0x3e,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getWeightForRCF(data,0x7fffffff);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getWeightForRCF(data, VeryHighIndex)\n",0x4a,1,
           _stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getWeightForRCF((RDL_data *)0x0,0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getWeightForRCF(NULL, 0)\n",0x3e,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNodesForURF(data,0x7fffffff,&nodes);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNodesForURF(data, VeryHighIndex, &family_nodes1)\n"
           ,0x59,1,_stderr);
    uVar8 = 1;
  }
  free(nodes);
  uVar1 = RDL_getNodesForURF((RDL_data *)0x0,0,&nodes);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNodesForURF(NULL, 0, &family_nodes1)\n",0x4d,1,
           _stderr);
    uVar8 = 1;
  }
  free(nodes);
  uVar1 = RDL_getEdgesForURF(data,0x7fffffff,&edges);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgesForURF(data, VeryHighIndex, &family_edges1)\n"
           ,0x59,1,_stderr);
    uVar8 = 1;
  }
  free(edges);
  uVar1 = RDL_getEdgesForURF((RDL_data *)0x0,0,&edges);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgesForURF(NULL, 0, &family_edges1)\n",0x4d,1,
           _stderr);
    uVar8 = 1;
  }
  free(edges);
  uVar1 = RDL_getNodesForRCF(data,0x7fffffff,&nodes);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNodesForRCF(data, VeryHighIndex, &rcf_nodes1)\n"
           ,0x56,1,_stderr);
    uVar8 = 1;
  }
  free(nodes);
  uVar1 = RDL_getNodesForRCF((RDL_data *)0x0,0,&nodes);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNodesForURF(NULL, 0, &family_nodes1)\n",0x4d,1,
           _stderr);
    uVar8 = 1;
  }
  free(nodes);
  uVar1 = RDL_getEdgesForRCF(data,0x7fffffff,&edges);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgesForRCF(data, VeryHighIndex, &rcf_edges1)\n"
           ,0x56,1,_stderr);
    uVar8 = 1;
  }
  free(edges);
  uVar1 = RDL_getEdgesForRCF((RDL_data *)0x0,0,&edges);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgesForRCF(NULL, 0q, &rcf_edges1)\n",0x4b,1,
           _stderr);
    uVar8 = 1;
  }
  free(edges);
  uVar1 = RDL_getURFsContainingNode(data,0x7fffffff,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getURFsContainingNode(data, VeryHighIndex, &families_for_node2)\n"
           ,0x65,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getURFsContainingNode((RDL_data *)0x0,0,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getURFsContainingNode(NULL, 0, &families_for_node2)\n"
           ,0x59,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getNofURFContainingNode(data,0x7fffffff);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofURFContainingNode(data, VeryHighIndex)\n",
           0x52,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofURFContainingNode((RDL_data *)0x0,0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofURFContainingNode(NULL, 0)\n",0x46,1,_stderr)
    ;
    uVar8 = 1;
  }
  uVar1 = RDL_getURFsContainingEdge(data,0x7fffffff,0x80000000,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getURFsContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1, &families_for_edge2)\n"
           ,0x79,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getURFsContainingEdge(data,0,0,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getURFsContainingEdge(data, 0, 0, &families_for_edge2)\n"
           ,0x5c,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getURFsContainingEdge((RDL_data *)0x0,0,0,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getURFsContainingEdge(NULL, 0, 0, &families_for_edge2)\n"
           ,0x5c,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getNofURFContainingEdge(data,0x7fffffff,0x80000000);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofURFContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1)\n"
           ,0x66,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofURFContainingEdge((RDL_data *)0x0,0,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofURFContainingEdge(NULL, 0, 1)\n",0x49,1,
           _stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofURFContainingEdge(data,1,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofURFContainingEdge(data, 1, 1)\n",0x49,1,
           _stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getRCFsContainingNode(data,0x7fffffff,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCFsContainingNode(data, VeryHighIndex, &families_for_node2)\n"
           ,0x65,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getRCFsContainingNode((RDL_data *)0x0,0,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCFsContainingNode(NULL, 0, &families_for_node2)\n"
           ,0x59,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getNofRCFContainingNode(data,0x7fffffff);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofRCFContainingNode(data, VeryHighIndex)\n",
           0x52,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofRCFContainingNode((RDL_data *)0x0,0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofRCFContainingNode(NULL, 0)\n",0x46,1,_stderr)
    ;
    uVar8 = 1;
  }
  uVar1 = RDL_getRCFsContainingEdge(data,0x7fffffff,0x80000000,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCFsContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1, &families_for_edge2)\n"
           ,0x79,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getRCFsContainingEdge(data,0,0,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCFsContainingEdge(data, 0, 0, &families_for_edge2)\n"
           ,0x5c,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getRCFsContainingEdge((RDL_data *)0x0,0,0,&families);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRCFsContainingEdge(NULL, 0, 0, &families_for_edge2)\n"
           ,0x5c,1,_stderr);
    uVar8 = 1;
  }
  free(families);
  uVar1 = RDL_getNofRCFContainingEdge(data,0x7fffffff,0x80000000);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofRCFContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1)\n"
           ,0x66,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofRCFContainingEdge((RDL_data *)0x0,0,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofRCFContainingEdge(NULL, 0, 1)\n",0x49,1,
           _stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofRCFContainingEdge(data,1,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofRCFContainingEdge(data, 1, 1)\n",0x49,1,
           _stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofRingsystems((RDL_data *)0x0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofRingsystems(NULL)\n",0x3d,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofNodesForRingsystem(data,0x7fffffff);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofNodesForRingsystem(data, VeryHighIndex)\n",
           0x53,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofNodesForRingsystem((RDL_data *)0x0,0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofNodesForRingsystem(NULL, 0)\n",0x47,1,_stderr
          );
    uVar8 = 1;
  }
  uVar1 = RDL_getNofEdgesForRingsystem(data,0x7fffffff);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofEdgesForRingsystem(data, VeryHighIndex)\n",
           0x53,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getNofEdgesForRingsystem((RDL_data *)0x0,0);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNofEdgesForRingsystem(NULL, 0)\n",0x47,1,_stderr
          );
    uVar8 = 1;
  }
  uVar1 = RDL_getNodesForRingsystem(data,0x7fffffff,&nodes);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNodesForRingsystem(data, VeryHighIndex, &family_nodes1)\n"
           ,0x60,1,_stderr);
    uVar8 = 1;
  }
  free(nodes);
  uVar1 = RDL_getNodesForRingsystem((RDL_data *)0x0,0,&nodes);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getNodesForRingsystem(NULL, 0, &family_nodes1)\n",
           0x54,1,_stderr);
    uVar8 = 1;
  }
  free(nodes);
  uVar1 = RDL_getEdgesForRingsystem(data,0x7fffffff,&edges);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgesForRingsystem(data, VeryHighIndex, &family_edges1)\n"
           ,0x60,1,_stderr);
    uVar8 = 1;
  }
  free(edges);
  uVar1 = RDL_getEdgesForRingsystem((RDL_data *)0x0,0,&edges);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getEdgesForRingsystem(NULL, 0, &family_edges1)\n",
           0x54,1,_stderr);
    uVar8 = 1;
  }
  free(edges);
  uVar1 = RDL_getRingsystemForEdge(data,0x7fffffff,0x80000000);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRingsystemForEdge(data, VeryHighIndex, VeryHighIndexPlus1)\n"
           ,99,1,_stderr);
    uVar8 = 1;
  }
  uVar1 = RDL_getRingsystemForEdge(data,1,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRingsystemForEdge(data, 1, 1)\n",0x46,1,_stderr)
    ;
    uVar8 = 1;
  }
  uVar1 = RDL_getRingsystemForEdge((RDL_data *)0x0,0,1);
  if (uVar1 != 0xffffffff) {
    fwrite("failed to detect invalid result: RDL_getRingsystemForEdge(NULL, 0, 1)\n",0x46,1,_stderr)
    ;
    uVar8 = 1;
  }
  (*RDL_outputFunc)(RDL_DEBUG,"} end expected errors\n");
  return uVar8;
}

Assistant:

int RDL_checkInvalidConsistency(const RDL_data* data)
{
  RDL_edge *edges;
  RDL_node *nodes;

  RDL_cycle **cycle_array;
  unsigned *families;

  unsigned result = 0;
  unsigned result_num;
  double result_num_double;
  const unsigned VeryHighIndex = UINT_MAX/2;
  const unsigned VeryHighIndexPlus1 = VeryHighIndex + 1;

  RDL_graph *empty_graph;
  RDL_data *empty_result;
  RDL_cycleIterator *it;

  /* the next errors on the RDL error function output are expected! */
  RDL_outputFunc(RDL_DEBUG, "The following errors are expected {\n");

  empty_graph = RDL_initNewGraph(0);

  /* test RDL_calculate */
  empty_result = RDL_calculate(NULL);
  if (empty_result) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_calculate(NULL)\n");
    result = 1;
  }

  empty_result = RDL_calculate(empty_graph);
  if (empty_result) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_calculate(empty_graph)\n");
    result = 1;
  }

  RDL_deleteGraph(empty_graph);

  /* test RDL_addUEdge */
  empty_graph = RDL_initNewGraph(2);
  if (RDL_addUEdge(empty_graph, 1, 2) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_addUEdge(empty_graph, 1, 2)\n");
    result = 1;
  }

  RDL_addUEdge(empty_graph, 0, 1);
  if (RDL_addUEdge(empty_graph, 1, 0) != RDL_DUPLICATE_EDGE) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_addUEdge(empty_graph, 0, 1)\n");
    result = 1;
  }

  if (RDL_addUEdge(empty_graph, 1, 1) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_addUEdge(empty_graph, 1, 1)\n");
    result = 1;
  }

  RDL_deleteGraph(empty_graph);

  /* test RDL_getNofURF */
  if (RDL_getNofURF(NULL) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofURF(NULL)\n");
    result = 1;
  }

  /* test RDL_getNofRCF */
  if (RDL_getNofRCF(NULL) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCF(NULL)\n");
    result = 1;
  }

  /* test RDL_getNofRCForURF */
  result_num_double = RDL_getNofRCForURF(data, VeryHighIndex);
  if (result_num_double != RDL_INVALID_RC_COUNT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCForURF(data, VeryHighIndex)\n");
    result = 1;
  }

  result_num_double = RDL_getNofRCForURF(NULL, 0);
  if (result_num_double != RDL_INVALID_RC_COUNT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCForURF(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_edgeId */
  if (RDL_getEdgeId(data, 1, 1) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgeId(data, 1, 1)\n");
    result = 1;
  }

  if (RDL_getEdgeId(NULL, 1, 1) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgeId(data, 1, 1)\n");
    result = 1;
  }

  if (RDL_getEdgeId(data, VeryHighIndex, 1) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgeId(data, VeryHighIndex, 1)\n");
    result = 1;
  }

  if (RDL_getEdgeId(data, 1, VeryHighIndex) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgeId(data, 1, VeryHighIndex)\n");
    result = 1;
  }

  /* test RDL_getNofRCForRCF */
  result_num_double = RDL_getNofRCForRCF(data, VeryHighIndex);
  if (result_num_double != RDL_INVALID_RC_COUNT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCForRCF(data, VeryHighIndex)\n");
    result = 1;
  }

  result_num_double = RDL_getNofRCForRCF(NULL, 0);
  if (result_num_double != RDL_INVALID_RC_COUNT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCForRCF(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getNofRC */
  result_num_double = RDL_getNofRC(NULL);
  if (result_num_double != RDL_INVALID_RC_COUNT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRC(NULL)\n");
    result = 1;
  }

  /* test RDL_getRCyclesForURF */
  result_num = RDL_getRCyclesForURF(data, VeryHighIndex, &cycle_array);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForURF(data, VeryHighIndex, &cycle_array1)\n");
    result = 1;
  }
  RDL_deleteCycles(cycle_array, 0);

  /* test RDL_getRCyclesForURF */
  result_num = RDL_getRCyclesForURF(NULL, 0, &cycle_array);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForURF(NULL, 0, &cycle_array1)\n");
    result = 1;
  }
  RDL_deleteCycles(cycle_array, 0);

  /* test RDL_getRCyclesForURFIterator */
  it = RDL_getRCyclesForURFIterator(data, VeryHighIndex);
  if (it != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForURFIterator(data, VeryHighIndex)\n");
    result = 1;
  }

  /* test RDL_getRCyclesForURFIterator */
  it = RDL_getRCyclesForURFIterator(NULL, 0);
  if (it != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForURFIterator(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getRCyclesForRCF */
  result_num = RDL_getRCyclesForRCF(data, VeryHighIndex, &cycle_array);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForRCF(data, VeryHighIndex, &cycle_array1)\n");
    result = 1;
  }
  RDL_deleteCycles(cycle_array, 0);

  /* test RDL_getRCyclesForRCF */
  result_num = RDL_getRCyclesForRCF(NULL, 0, &cycle_array);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForRCF(NULL, 0, &cycle_array1)\n");
    result = 1;
  }
  RDL_deleteCycles(cycle_array, 0);

  /* test RDL_getRCyclesForRCFIterator */
  it = RDL_getRCyclesForRCFIterator(data, VeryHighIndex);
  if (it != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForRCFIterator(data, VeryHighIndex)\n");
    result = 1;
  }

  /* test RDL_getRCyclesForRCFIterator */
  it = RDL_getRCyclesForRCFIterator(NULL, 0);
  if (it != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesForRCFIterator(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getRCycles */
  result_num = RDL_getRCycles(NULL, &cycle_array);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCycles(NULL, &cycle_array1)\n");
    result = 1;
  }
  RDL_deleteCycles(cycle_array, 0);

  /* test RDL_getRCyclesIterator */
  it = RDL_getRCyclesIterator(NULL);
  if (it != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCyclesIterator(NULL)\n");
    result = 1;
  }

  /* test RDL_cycleIteratorAtEnd */
  if (!RDL_cycleIteratorAtEnd(NULL)) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_cycleIteratorAtEnd(NULL)\n");
    result = 1;
  }

  /* RDL_cycleIteratorNext */
  it = RDL_getRCyclesIterator(data);
  while (!RDL_cycleIteratorAtEnd(it)) {
    RDL_cycleIteratorNext(it);
  }
  if (!it || RDL_cycleIteratorNext(it) != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_cycleIteratorNext(it)\n");
    result = 1;
  }

  if (RDL_cycleIteratorNext(NULL) != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_cycleIteratorNext(NULL)\n");
    result = 1;
  }

  /* RDL_cycleIteratorGetCycle */
  if (RDL_cycleIteratorGetCycle(NULL) != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_cycleIteratorGetCycle(NULL)\n");
    result = 1;
  }

  if (!it || RDL_cycleIteratorGetCycle(it) != NULL) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_cycleIteratorGetCycle(it)\n");
    result = 1;
  }

  RDL_deleteCycleIterator(it);

  /* test RDL_getRCPrototypes*/
  result_num = RDL_getRCPrototypes(NULL, &cycle_array);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCPrototypes(NULL, &cycle_array1)\n");
    result = 1;
  }
  RDL_deleteCycles(cycle_array, 0);

  /* test RDL_getSSSR */
  result_num = RDL_getSSSR(NULL, &cycle_array);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getSSSR(NULL, &cycle_array1)\n");
    result = 1;
  }
  RDL_deleteCycles(cycle_array, 0);

  /* test RDL_getWeightForURF */
  result_num = RDL_getWeightForURF(data, VeryHighIndex);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getWeightForURF(data, VeryHighIndex)\n");
    result = 1;
  }

  result_num = RDL_getWeightForURF(NULL, 0);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getWeightForURF(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getWeightForRCF */
  result_num = RDL_getWeightForRCF(data, VeryHighIndex);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getWeightForRCF(data, VeryHighIndex)\n");
    result = 1;
  }

  result_num = RDL_getWeightForRCF(NULL, 0);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getWeightForRCF(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getNodesForURF */
  result_num = RDL_getNodesForURF(data, VeryHighIndex, &nodes);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNodesForURF(data, VeryHighIndex, &family_nodes1)\n");
    result = 1;
  }
  free(nodes);

  result_num = RDL_getNodesForURF(NULL, 0, &nodes);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNodesForURF(NULL, 0, &family_nodes1)\n");
    result = 1;
  }
  free(nodes);

  /* test RDL_getEdgesForURF */
  result_num = RDL_getEdgesForURF(data, VeryHighIndex, &edges);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgesForURF(data, VeryHighIndex, &family_edges1)\n");
    result = 1;
  }
  free(edges);

  result_num = RDL_getEdgesForURF(NULL, 0, &edges);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,"failed to detect invalid result: RDL_getEdgesForURF(NULL, 0, &family_edges1)\n");
    result = 1;
  }
  free(edges);

  /* test RDL_getNodesForRCF */
  result_num = RDL_getNodesForRCF(data, VeryHighIndex, &nodes);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNodesForRCF(data, VeryHighIndex, &rcf_nodes1)\n");
    result = 1;
  }
  free(nodes);

  result_num = RDL_getNodesForRCF(NULL, 0, &nodes);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNodesForURF(NULL, 0, &family_nodes1)\n");
    result = 1;
  }
  free(nodes);

  /* test RDL_getEdgesForRCF */
  result_num = RDL_getEdgesForRCF(data, VeryHighIndex, &edges);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgesForRCF(data, VeryHighIndex, &rcf_edges1)\n");
    result = 1;
  }
  free(edges);

  result_num = RDL_getEdgesForRCF(NULL, 0, &edges);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgesForRCF(NULL, 0q, &rcf_edges1)\n");
    result = 1;
  }
  free(edges);

  /* test RDL_getURFsContainingNode */
  result_num = RDL_getURFsContainingNode(data, VeryHighIndex, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getURFsContainingNode(data, VeryHighIndex, &families_for_node2)\n");
    result = 1;
  }
  free(families);

  result_num = RDL_getURFsContainingNode(NULL, 0, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getURFsContainingNode(NULL, 0, &families_for_node2)\n");
    result = 1;
  }
  free(families);

  /* test RDL_getNofURFContainingNode */
  result_num = RDL_getNofURFContainingNode(data, VeryHighIndex);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofURFContainingNode(data, VeryHighIndex)\n");
    result = 1;
  }

  result_num = RDL_getNofURFContainingNode(NULL, 0);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofURFContainingNode(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getURFsContainingEdge */
  result_num = RDL_getURFsContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getURFsContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1, &families_for_edge2)\n");
    result = 1;
  }
  free(families);

  result_num = RDL_getURFsContainingEdge(data, 0, 0, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getURFsContainingEdge(data, 0, 0, &families_for_edge2)\n");
    result = 1;
  }
  free(families);

  result_num = RDL_getURFsContainingEdge(NULL, 0, 0, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getURFsContainingEdge(NULL, 0, 0, &families_for_edge2)\n");
    result = 1;
  }
  free(families);

  /* test RDL_getNofURFContainingEdge */
  result_num = RDL_getNofURFContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofURFContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1)\n");
    result = 1;
  }

  result_num = RDL_getNofURFContainingEdge(NULL, 0, 1);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofURFContainingEdge(NULL, 0, 1)\n");
    result = 1;
  }

  result_num = RDL_getNofURFContainingEdge(data, 1, 1);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofURFContainingEdge(data, 1, 1)\n");
    result = 1;
  }

  /* test RDL_getRCFsContainingNode */
  result_num = RDL_getRCFsContainingNode(data, VeryHighIndex, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCFsContainingNode(data, VeryHighIndex, &families_for_node2)\n");
    result = 1;
  }
  free(families);

  result_num = RDL_getRCFsContainingNode(NULL, 0, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCFsContainingNode(NULL, 0, &families_for_node2)\n");
    result = 1;
  }
  free(families);

  /* test RDL_getNofRCFContainingNode */
  result_num = RDL_getNofRCFContainingNode(data, VeryHighIndex);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCFContainingNode(data, VeryHighIndex)\n");
    result = 1;
  }

  result_num = RDL_getNofRCFContainingNode(NULL, 0);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCFContainingNode(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getRCFsContainingEdge */
  result_num = RDL_getRCFsContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCFsContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1, &families_for_edge2)\n");
    result = 1;
  }
  free(families);

  result_num = RDL_getRCFsContainingEdge(data, 0, 0, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCFsContainingEdge(data, 0, 0, &families_for_edge2)\n");
    result = 1;
  }
  free(families);

  result_num = RDL_getRCFsContainingEdge(NULL, 0, 0, &families);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRCFsContainingEdge(NULL, 0, 0, &families_for_edge2)\n");
    result = 1;
  }
  free(families);

  /* test RDL_getNofRCFContainingEdge */
  result_num = RDL_getNofRCFContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCFContainingEdge(data, VeryHighIndex, VeryHighIndexPlus1)\n");
    result = 1;
  }

  result_num = RDL_getNofRCFContainingEdge(NULL, 0, 1);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCFContainingEdge(NULL, 0, 1)\n");
    result = 1;
  }

  result_num = RDL_getNofRCFContainingEdge(data, 1, 1);
  if (result_num != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRCFContainingEdge(data, 1, 1)\n");
    result = 1;
  }

  /* test RDL_getNofRingsystems */
  if (RDL_getNofRingsystems(NULL) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofRingsystems(NULL)\n");
    result = 1;
  }

  /* test RDL_getNofNodesForRingsystem */
  if (RDL_getNofNodesForRingsystem(data, VeryHighIndex) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofNodesForRingsystem(data, VeryHighIndex)\n");
    result = 1;
  }

  if (RDL_getNofNodesForRingsystem(NULL, 0) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofNodesForRingsystem(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getNofedgesForRingsystem */
  if (RDL_getNofEdgesForRingsystem(data, VeryHighIndex) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofEdgesForRingsystem(data, VeryHighIndex)\n");
    result = 1;
  }

  if (RDL_getNofEdgesForRingsystem(NULL, 0) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNofEdgesForRingsystem(NULL, 0)\n");
    result = 1;
  }

  /* test RDL_getNodesForRingsystem */
  if (RDL_getNodesForRingsystem(data, VeryHighIndex, &nodes) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNodesForRingsystem(data, VeryHighIndex, &family_nodes1)\n");
    result = 1;
  }
  free(nodes);

  if (RDL_getNodesForRingsystem(NULL, 0, &nodes) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getNodesForRingsystem(NULL, 0, &family_nodes1)\n");
    result = 1;
  }
  free(nodes);

  /* test RDL_getEdgesForRingsystem */
  if (RDL_getEdgesForRingsystem(data, VeryHighIndex, &edges) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgesForRingsystem(data, VeryHighIndex, &family_edges1)\n");
    result = 1;
  }
  free(edges);

  if (RDL_getEdgesForRingsystem(NULL, 0, &edges) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getEdgesForRingsystem(NULL, 0, &family_edges1)\n");
    result = 1;
  }
  free(edges);

  /* test RDL_getRingsystemForEdge */
  if (RDL_getRingsystemForEdge(data, VeryHighIndex, VeryHighIndexPlus1) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRingsystemForEdge(data, VeryHighIndex, VeryHighIndexPlus1)\n");
    result = 1;
  }

  if (RDL_getRingsystemForEdge(data, 1, 1) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRingsystemForEdge(data, 1, 1)\n");
    result = 1;
  }

  if (RDL_getRingsystemForEdge(NULL, 0, 1) != RDL_INVALID_RESULT) {
    fprintf(stderr,
        "failed to detect invalid result: RDL_getRingsystemForEdge(NULL, 0, 1)\n");
    result = 1;
  }

  RDL_outputFunc(RDL_DEBUG, "} end expected errors\n");

  return result;
}